

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

bool __thiscall pm::Sphere::shadowHit(Sphere *this,Ray *ray,float *tMin)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float denom;
  float e;
  float t;
  float disc;
  float c;
  float b;
  float a;
  Vector3 temp;
  bool hasHit;
  float *tMin_local;
  Ray *ray_local;
  Sphere *this_local;
  
  if (((this->super_Geometry).castShadows_ & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    temp.y._3_1_ = 0;
    unique0x1000019a = tMin;
    Vector3::operator-((Vector3 *)&b,&ray->o);
    fVar1 = dot(&ray->d,&ray->d);
    fVar2 = dot((Vector3 *)&b,&ray->d);
    fVar2 = fVar2 * 2.0;
    fVar3 = dot((Vector3 *)&b,(Vector3 *)&b);
    fVar3 = fVar2 * fVar2 + -(fVar1 * 4.0 * (-this->radius_ * this->radius_ + fVar3));
    if (0.0 < fVar3) {
      fVar3 = sqrtf(fVar3);
      fVar4 = (-fVar2 - fVar3) / (fVar1 * 2.0);
      if (fVar4 <= 1e-09) {
        fVar1 = (-fVar2 + fVar3) / (fVar1 * 2.0);
        if (1e-09 < fVar1) {
          *stack0xffffffffffffffd8 = fVar1;
          temp.y._3_1_ = 1;
        }
      }
      else {
        *stack0xffffffffffffffd8 = fVar4;
        temp.y._3_1_ = 1;
      }
    }
    this_local._7_1_ = (bool)(temp.y._3_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Sphere::shadowHit(const Ray &ray, float &tMin) const
{
	if (castShadows_ == false)
		return false;

	bool hasHit = false;
	const Vector3 temp = ray.o - center_;
	const float a = dot(ray.d, ray.d);
	const float b = 2.0f * dot(temp, ray.d);
	const float c = dot(temp, temp) - radius_ * radius_;
	const float disc = b * b - 4.0f * a * c;

	if (disc > 0.0f)
	{
		float t = 0.0f;
		const float e = sqrtf(disc);
		const float denom = 2.0f * a;

		t = (-b - e) / denom; // smaller root
		if (t > ShadowEpsilon)
		{
			tMin = t;
			hasHit = true;
		}
		else
		{
			t = (-b + e) / denom; // larger root
			if (t > ShadowEpsilon)
			{
				tMin = t;
				hasHit = true;
			}
		}
	}

	return hasHit;
}